

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O2

void __thiscall
flatbuffers::vector_downward<unsigned_int>::reallocate
          (vector_downward<unsigned_int> *this,size_t len)

{
  uint uVar1;
  ulong old_size;
  uint8_t *puVar2;
  uint8_t *puVar3;
  ulong size;
  size_t sVar4;
  ulong in_use_front;
  
  old_size = this->reserved_;
  uVar1 = this->size_;
  puVar3 = this->buf_;
  if (old_size == 0) {
    sVar4 = this->initial_size_;
  }
  else {
    sVar4 = old_size >> 1;
  }
  if (len < sVar4) {
    len = sVar4;
  }
  puVar2 = this->scratch_;
  size = -this->buffer_minalign_ & (len + old_size + this->buffer_minalign_) - 1;
  this->reserved_ = size;
  if (puVar3 == (uint8_t *)0x0) {
    puVar3 = Allocate(this->allocator_,size);
    in_use_front = (ulong)puVar2 & 0xffffffff;
  }
  else {
    in_use_front = (ulong)(uint)((int)puVar2 - (int)puVar3);
    puVar3 = ReallocateDownward(this->allocator_,puVar3,old_size,size,(ulong)uVar1,in_use_front);
  }
  this->buf_ = puVar3;
  this->cur_ = puVar3 + (this->reserved_ - (ulong)uVar1);
  this->scratch_ = puVar3 + in_use_front;
  return;
}

Assistant:

void reallocate(size_t len) {
    auto old_reserved = reserved_;
    auto old_size = size();
    auto old_scratch_size = scratch_size();
    reserved_ +=
        (std::max)(len, old_reserved ? old_reserved / 2 : initial_size_);
    reserved_ = (reserved_ + buffer_minalign_ - 1) & ~(buffer_minalign_ - 1);
    if (buf_) {
      buf_ = ReallocateDownward(allocator_, buf_, old_reserved, reserved_,
                                old_size, old_scratch_size);
    } else {
      buf_ = Allocate(allocator_, reserved_);
    }
    cur_ = buf_ + reserved_ - old_size;
    scratch_ = buf_ + old_scratch_size;
  }